

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  char *test_suite_name;
  ostream *poVar1;
  TestInfo *pTVar2;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  int i;
  int i_00;
  undefined1 local_90 [8];
  string kTestsuite;
  string local_50;
  int local_30;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"testsuite",(allocator<char> *)&local_50);
  poVar1 = std::operator<<(stream,"  <");
  std::operator<<(poVar1,(string *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"name",(allocator<char> *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(kTestsuite.field_2._M_local_buf + 8),(test_suite->name_)._M_dataplus._M_p,
             &local_29);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"tests",&local_29);
  local_30 = TestSuite::reportable_test_count(test_suite);
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
  OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_50);
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"failures",&local_29);
    local_30 = TestSuite::failed_test_count(test_suite);
    StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"disabled",&local_29);
    local_30 = TestSuite::reportable_disabled_test_count(test_suite);
    StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"skipped",&local_29);
    local_30 = TestSuite::skipped_test_count(test_suite);
    StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_30);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"errors",(allocator<char> *)&local_30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(kTestsuite.field_2._M_local_buf + 8),"0",&local_29);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"time",(allocator<char> *)&local_30);
    FormatTimeInMillisAsSeconds_abi_cxx11_
              ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_suite->elapsed_time_,ms);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"timestamp",(allocator<char> *)&local_30);
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_
              ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_suite->start_timestamp_,
               ms_00);
    OutputXmlAttribute(stream,(string *)local_90,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    std::__cxx11::string::~string((string *)(kTestsuite.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_50);
    TestPropertiesAsXmlAttributes_abi_cxx11_
              (&local_50,(XmlUnitTestResultPrinter *)&test_suite->ad_hoc_test_result_,result);
    std::operator<<(stream,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::operator<<(stream,">\n");
  for (i_00 = 0;
      i_00 < (int)((ulong)((long)(test_suite->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(test_suite->test_info_list_).
                                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar2 = TestSuite::GetTestInfo(test_suite,i_00);
    if ((pTVar2->matches_filter_ == true) && ((pTVar2->is_in_another_shard_ & 1U) == 0)) {
      test_suite_name = (test_suite->name_)._M_dataplus._M_p;
      pTVar2 = TestSuite::GetTestInfo(test_suite,i_00);
      OutputXmlTestInfo(stream,test_suite_name,pTVar2);
    }
  }
  poVar1 = std::operator<<(stream,"  </");
  poVar1 = std::operator<<(poVar1,(string *)local_90);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "skipped",
                       StreamableToString(test_suite.skipped_test_count()));

    OutputXmlAttribute(stream, kTestsuite, "errors", "0");

    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
    *stream << TestPropertiesAsXmlAttributes(test_suite.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}